

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::PrepareStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,PrepareStatement *this)

{
  pointer pSVar1;
  allocator local_30 [32];
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pSVar1 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(&this->statement);
  (*pSVar1->_vptr_SQLStatement[2])(local_30,pSVar1);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

string PrepareStatement::ToString() const {
	string result = "";
	result += "PREPARE";
	result += " ";
	result += name;
	result += " ";
	result += "AS";
	result += " ";
	result += statement->ToString();
	// NOTE: We expect SQLStatement->ToString() to always end in a ';' ^
	return result;
}